

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  bool bVar1;
  uint local_98;
  size_t local_90;
  size_t size;
  uchar *str;
  char *transkey;
  char *langtag;
  char *key;
  uint local_60;
  uint compressed;
  uint begin;
  uint length;
  LodePNGDecompressSettings zlibsettings;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecoderSettings *decoder_local;
  LodePNGInfo *info_local;
  
  zlibsettings.custom_context._4_4_ = 0;
  memcpy(&begin,decoder,0x28);
  langtag = (char *)0x0;
  transkey = (char *)0x0;
  str = (uchar *)0x0;
  if (zlibsettings.custom_context._4_4_ == 0) {
    if (chunkLength < 5) {
      zlibsettings.custom_context._4_4_ = 0x1e;
    }
    else {
      compressed = 0;
      while( true ) {
        bVar1 = false;
        if (compressed < chunkLength) {
          bVar1 = data[compressed] != '\0';
        }
        if (!bVar1) break;
        compressed = compressed + 1;
      }
      if (compressed + 3 < chunkLength) {
        if ((compressed == 0) || (0x4f < compressed)) {
          zlibsettings.custom_context._4_4_ = 0x59;
        }
        else {
          langtag = (char *)lodepng_malloc((ulong)(compressed + 1));
          if (langtag == (char *)0x0) {
            zlibsettings.custom_context._4_4_ = 0x53;
          }
          else {
            lodepng_memcpy(langtag,data,(ulong)compressed);
            langtag[compressed] = '\0';
            key._4_4_ = (uint)data[compressed + 1];
            if (data[compressed + 2] == '\0') {
              local_60 = compressed + 3;
              compressed = 0;
              zlibsettings.custom_context._0_4_ = local_60;
              while( true ) {
                bVar1 = false;
                if ((uint)zlibsettings.custom_context < chunkLength) {
                  bVar1 = data[(uint)zlibsettings.custom_context] != '\0';
                }
                if (!bVar1) break;
                compressed = compressed + 1;
                zlibsettings.custom_context._0_4_ = (uint)zlibsettings.custom_context + 1;
              }
              transkey = (char *)lodepng_malloc((ulong)(compressed + 1));
              if (transkey == (char *)0x0) {
                zlibsettings.custom_context._4_4_ = 0x53;
              }
              else {
                lodepng_memcpy(transkey,data + local_60,(ulong)compressed);
                transkey[compressed] = '\0';
                local_60 = compressed + 1 + local_60;
                compressed = 0;
                zlibsettings.custom_context._0_4_ = local_60;
                while( true ) {
                  bVar1 = false;
                  if ((uint)zlibsettings.custom_context < chunkLength) {
                    bVar1 = data[(uint)zlibsettings.custom_context] != '\0';
                  }
                  if (!bVar1) break;
                  compressed = compressed + 1;
                  zlibsettings.custom_context._0_4_ = (uint)zlibsettings.custom_context + 1;
                }
                str = (uchar *)lodepng_malloc((ulong)(compressed + 1));
                if (str == (uchar *)0x0) {
                  zlibsettings.custom_context._4_4_ = 0x53;
                }
                else {
                  lodepng_memcpy(str,data + local_60,(ulong)compressed);
                  str[compressed] = '\0';
                  local_60 = compressed + 1 + local_60;
                  if ((uint)chunkLength < local_60) {
                    local_98 = 0;
                  }
                  else {
                    local_98 = (uint)chunkLength - local_60;
                  }
                  compressed = local_98;
                  if (key._4_4_ == 0) {
                    zlibsettings.custom_context._4_4_ =
                         lodepng_add_itext_sized
                                   (info,langtag,transkey,(char *)str,(char *)(data + local_60),
                                    (ulong)local_98);
                  }
                  else {
                    size = 0;
                    local_90 = 0;
                    zlibsettings._0_8_ = decoder->max_text_size;
                    zlibsettings.custom_context._4_4_ =
                         zlib_decompress((uchar **)&size,&local_90,0,data + local_60,(ulong)local_98
                                         ,(LodePNGDecompressSettings *)&begin);
                    if ((zlibsettings.custom_context._4_4_ != 0) &&
                       ((ulong)zlibsettings._0_8_ < local_90)) {
                      zlibsettings.custom_context._4_4_ = 0x70;
                    }
                    if (zlibsettings.custom_context._4_4_ == 0) {
                      zlibsettings.custom_context._4_4_ =
                           lodepng_add_itext_sized
                                     (info,langtag,transkey,(char *)str,(char *)size,local_90);
                    }
                    lodepng_free((void *)size);
                  }
                }
              }
            }
            else {
              zlibsettings.custom_context._4_4_ = 0x48;
            }
          }
        }
      }
      else {
        zlibsettings.custom_context._4_4_ = 0x4b;
      }
    }
  }
  lodepng_free(langtag);
  lodepng_free(transkey);
  lodepng_free(str);
  return zlibsettings.custom_context._4_4_;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(langtag, data + begin, length);
    langtag[length] = 0;

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(transkey, data + begin, length);
    transkey[length] = 0;

    /*read the actual text*/
    begin += length + 1;

    length = (unsigned)chunkLength < begin ? 0 : (unsigned)chunkLength - begin;

    if(compressed) {
      unsigned char* str = 0;
      size_t size = 0;
      zlibsettings.max_output_size = decoder->max_text_size;
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&str, &size, 0, &data[begin],
                              length, &zlibsettings);
      /*error: compressed text larger than  decoder->max_text_size*/
      if(error && size > zlibsettings.max_output_size) error = 112;
      if(!error) error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)str, size);
      lodepng_free(str);
    } else {
      error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)(data + begin), length);
    }

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);

  return error;
}